

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

FStateDefine * __thiscall FStateDefinitions::FindStateAddress(FStateDefinitions *this,char *name)

{
  FStateDefine *pFVar1;
  ulong uVar2;
  FName local_1c;
  
  MakeStateNameList(name);
  if (MakeStateNameList::namelist.Count == 0) {
    pFVar1 = (FStateDefine *)0x0;
  }
  else {
    uVar2 = 0;
    do {
      local_1c.Index = MakeStateNameList::namelist.Array[uVar2].Index;
      pFVar1 = FindStateLabelInList(&this->StateLabels,&local_1c,true);
      this = (FStateDefinitions *)&pFVar1->Children;
      uVar2 = uVar2 + 1;
    } while (uVar2 < MakeStateNameList::namelist.Count);
  }
  return pFVar1;
}

Assistant:

FStateDefine *FStateDefinitions::FindStateAddress(const char *name)
{
	FStateDefine *statedef = NULL;
	TArray<FName> &namelist = MakeStateNameList(name);
	TArray<FStateDefine> *statelist = &StateLabels;

	for(unsigned i = 0; i < namelist.Size(); i++)
	{
		statedef = FindStateLabelInList(*statelist, namelist[i], true);
		statelist = &statedef->Children;
	}
	return statedef;
}